

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.hpp
# Opt level: O2

bool __thiscall sglr::rc::Texture2D::isComplete(Texture2D *this)

{
  ChannelType *pCVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  TextureFormat *format;
  size_t *psVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int *piVar13;
  
  uVar2 = (this->super_Texture).m_baseLevel;
  uVar7 = (ulong)uVar2;
  if (0xd < uVar7) {
    return false;
  }
  if ((this->m_levels).m_data[uVar7].m_cap == 0) {
    bVar6 = false;
  }
  else {
    bVar6 = true;
    if (LINEAR < (this->super_Texture).m_sampler.minFilter) {
      uVar3 = (this->m_levels).m_access[uVar7].super_ConstPixelBufferAccess.m_size.m_data[0];
      uVar4 = (this->m_levels).m_access[uVar7].super_ConstPixelBufferAccess.m_size.m_data[1];
      iVar10 = ((this->super_Texture).m_maxLevel - uVar2) + 1;
      uVar5 = uVar4;
      if ((int)uVar4 < (int)uVar3) {
        uVar5 = uVar3;
      }
      uVar12 = 0x20;
      if (uVar5 != 0) {
        uVar12 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> uVar12 == 0; uVar12 = uVar12 - 1) {
          }
        }
        uVar12 = uVar12 ^ 0x1f;
      }
      iVar11 = 0x20 - uVar12;
      if (iVar10 < (int)(0x20 - uVar12)) {
        iVar11 = iVar10;
      }
      psVar9 = &(this->m_levels).m_data[uVar7 + 1].m_cap;
      uVar8 = 1;
      piVar13 = (this->m_levels).m_access[uVar7 + 1].super_ConstPixelBufferAccess.m_size.m_data + 1;
      while (((bVar6 = (long)iVar11 <= (long)uVar8, (long)uVar8 < (long)iVar11 &&
              (0xe - uVar2 != uVar8)) && (*psVar9 != 0))) {
        iVar10 = (int)uVar3 >> ((byte)uVar8 & 0x1f);
        if (iVar10 < 2) {
          iVar10 = 1;
        }
        if (((IVec3 *)(piVar13 + -1))->m_data[0] != iVar10) {
          return bVar6;
        }
        iVar10 = (int)uVar4 >> ((byte)uVar8 & 0x1f);
        if (iVar10 < 2) {
          iVar10 = 1;
        }
        if (*piVar13 != iVar10) {
          return bVar6;
        }
        if (piVar13[-3] !=
            (this->m_levels).m_access[uVar7].super_ConstPixelBufferAccess.m_format.order) {
          return bVar6;
        }
        uVar8 = uVar8 + 1;
        psVar9 = psVar9 + 2;
        pCVar1 = (ChannelType *)(piVar13 + -2);
        piVar13 = piVar13 + 10;
        if (*pCVar1 != (this->m_levels).m_access[uVar7].super_ConstPixelBufferAccess.m_format.type)
        {
          return bVar6;
        }
      }
    }
  }
  return bVar6;
}

Assistant:

int							getBaseLevel	(void) const	{ return m_baseLevel;		}